

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QStyle * __thiscall QStyleSheetStyle::baseStyle(QStyleSheetStyle *this)

{
  QStyleSheetStyle *pQVar1;
  long in_RDI;
  QStyleSheetStyle *me;
  QStyle *local_8;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    QApplication::style();
    pQVar1 = qt_styleSheet((QStyle *)0x42771b);
    if (pQVar1 == (QStyleSheetStyle *)0x0) {
      local_8 = QApplication::style();
    }
    else {
      local_8 = pQVar1->base;
    }
  }
  else {
    local_8 = *(QStyle **)(in_RDI + 0x10);
  }
  return local_8;
}

Assistant:

QStyle *QStyleSheetStyle::baseStyle() const
{
    if (base)
        return base;
    if (QStyleSheetStyle *me = qt_styleSheet(QApplication::style()))
        return me->base;
    return QApplication::style();
}